

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_connective.c
# Opt level: O0

t_float * value_get(t_symbol *s)

{
  t_pd *local_18;
  t_vcommon *c;
  t_symbol *s_local;
  
  local_18 = pd_findbyclass(s,vcommon_class);
  if (local_18 == (t_pd *)0x0) {
    local_18 = pd_new(vcommon_class);
    *(undefined4 *)((long)local_18 + 0xc) = 0;
    *(undefined4 *)(local_18 + 1) = 0;
    pd_bind(local_18,s);
  }
  *(int *)(local_18 + 1) = *(int *)(local_18 + 1) + 1;
  return (t_float *)((long)local_18 + 0xc);
}

Assistant:

t_float *value_get(t_symbol *s)
{
    t_vcommon *c = (t_vcommon *)pd_findbyclass(s, vcommon_class);
    if (!c)
    {
        c = (t_vcommon *)pd_new(vcommon_class);
        c->c_f = 0;
        c->c_refcount = 0;
        pd_bind(&c->c_pd, s);
    }
    c->c_refcount++;
    return (&c->c_f);
}